

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall
TCLAP::StdOutput::spacePrint
          (StdOutput *this,ostream *os,string *s,int maxWidth,int indentSpaces,int secondLineOffset)

{
  int *piVar1;
  char *pcVar2;
  ostream *poVar3;
  int in_ECX;
  string *in_RDX;
  ostream *in_RSI;
  int in_R8D;
  int in_R9D;
  bool bVar4;
  int i_2;
  int i_1;
  int i;
  int stringLen;
  int start;
  int allowedLen;
  int len;
  int local_70;
  string local_60 [32];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  string *local_18;
  ostream *local_10;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = std::__cxx11::string::length();
  if ((local_1c < local_28 + local_20) && (0 < local_1c)) {
    local_2c = local_1c - local_20;
    for (local_30 = 0; local_30 < local_28; local_30 = local_34 + local_30) {
      local_38 = local_28 - local_30;
      piVar1 = std::min<int>(&local_38,&local_2c);
      local_34 = *piVar1;
      if (local_34 == local_2c) {
        while( true ) {
          bVar4 = false;
          if (-1 < local_34) {
            pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
            bVar4 = false;
            if (*pcVar2 != ' ') {
              pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
              bVar4 = false;
              if (*pcVar2 != ',') {
                pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
                bVar4 = *pcVar2 != '|';
              }
            }
          }
          if (!bVar4) break;
          local_34 = local_34 + -1;
        }
      }
      if (local_34 < 1) {
        local_34 = local_2c;
      }
      for (local_3c = 0; local_3c < local_34; local_3c = local_3c + 1) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
        if (*pcVar2 == '\n') {
          local_34 = local_3c + 1;
        }
      }
      for (local_40 = 0; poVar3 = local_10, local_40 < local_20; local_40 = local_40 + 1) {
        std::operator<<(local_10," ");
      }
      if (local_30 == 0) {
        local_20 = local_24 + local_20;
        local_2c = local_2c - local_24;
      }
      std::__cxx11::string::substr((ulong)local_60,(ulong)local_18);
      poVar3 = std::operator<<(poVar3,local_60);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_60);
      while (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18),
            *pcVar2 == ' ' && local_30 < local_28) {
        local_30 = local_30 + 1;
      }
    }
  }
  else {
    for (local_70 = 0; local_70 < local_20; local_70 = local_70 + 1) {
      std::operator<<(local_10," ");
    }
    poVar3 = std::operator<<(local_10,local_18);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

inline void StdOutput::spacePrint( std::ostream& os, 
						           const std::string& s, 
						           int maxWidth, 
						           int indentSpaces, 
						           int secondLineOffset ) const
{
	int len = static_cast<int>(s.length());

	if ( (len + indentSpaces > maxWidth) && maxWidth > 0 )
		{
			int allowedLen = maxWidth - indentSpaces;
			int start = 0;
			while ( start < len )
				{
					// find the substring length
					// int stringLen = std::min<int>( len - start, allowedLen );
					// doing it this way to support a VisualC++ 2005 bug 
					using namespace std; 
					int stringLen = min<int>( len - start, allowedLen );

					// trim the length so it doesn't end in middle of a word
					if ( stringLen == allowedLen )
						while ( stringLen >= 0 &&
								s[stringLen+start] != ' ' && 
								s[stringLen+start] != ',' &&
								s[stringLen+start] != '|' ) 
							stringLen--;
	
					// ok, the word is longer than the line, so just split 
					// wherever the line ends
					if ( stringLen <= 0 )
						stringLen = allowedLen;

					// check for newlines
					for ( int i = 0; i < stringLen; i++ )
						if ( s[start+i] == '\n' )
							stringLen = i+1;

					// print the indent	
					for ( int i = 0; i < indentSpaces; i++ )
						os << " ";

					if ( start == 0 )
						{
							// handle second line offsets
							indentSpaces += secondLineOffset;

							// adjust allowed len
							allowedLen -= secondLineOffset;
						}

					os << s.substr(start,stringLen) << std::endl;

					// so we don't start a line with a space
					while ( s[stringLen+start] == ' ' && start < len )
						start++;
			
					start += stringLen;
				}
		}
	else
		{
			for ( int i = 0; i < indentSpaces; i++ )
				os << " ";
			os << s << std::endl;
		}
}